

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O1

wchar_t * GherkinLine_get_language(GherkinLine *line)

{
  wchar_t wchar;
  _Bool _Var1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t *string;
  
  pwVar2 = line->trimmed_line + 1;
  for (pwVar4 = pwVar2; (pwVar4[-1] != L':' && (pwVar4[-1] != L'\0')); pwVar4 = pwVar4 + 1) {
    pwVar2 = pwVar2 + 1;
  }
  do {
    string = pwVar4;
    pwVar3 = pwVar2;
    if (*string == L'\0') break;
    _Var1 = StringUtilities_is_whitespace(*string);
    pwVar2 = pwVar3 + 1;
    pwVar4 = string + 1;
  } while (_Var1);
  wchar = *string;
  pwVar2 = string;
  while ((wchar != L'\0' && (_Var1 = StringUtilities_is_whitespace(wchar), !_Var1))) {
    wchar = pwVar2[1];
    pwVar2 = pwVar2 + 1;
  }
  pwVar2 = StringUtilities_copy_string_part
                     (string,(wchar_t)((ulong)((long)pwVar2 - (long)pwVar3) >> 2));
  return pwVar2;
}

Assistant:

const wchar_t* GherkinLine_get_language(const GherkinLine* line) {
    const wchar_t* start = line->trimmed_line;
    while (*start != L'\0' && *start != L':')
        ++start;
    ++start;
    while (*start != L'\0' && StringUtilities_is_whitespace(*start))
        ++start;
    const wchar_t* end = start;
    while (*end != L'\0' && !StringUtilities_is_whitespace(*end))
        ++end;
    return StringUtilities_copy_string_part(start, end - start);
}